

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  byte bVar1;
  TextGenerator generator;
  TextGenerator local_30;
  
  local_30.indent_level_ = this->initial_indent_level_;
  local_30.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_0064a9c0;
  local_30.buffer_ = (char *)0x0;
  local_30.buffer_size_ = 0;
  local_30.at_start_of_line_ = true;
  local_30.failed_ = false;
  local_30.output_ = output;
  local_30.initial_indent_level_ = local_30.indent_level_;
  PrintUnknownFields(this,unknown_fields,&local_30);
  bVar1 = local_30.failed_ ^ 1;
  TextGenerator::~TextGenerator(&local_30);
  return (bool)bVar1;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}